

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void state_CALLNZ(Context *ctx)

{
  RegisterType RVar1;
  RegisterType regtype;
  Context *ctx_local;
  
  RVar1 = ctx->source_args[1].regtype;
  if ((RVar1 != REG_TYPE_CONSTBOOL) && (RVar1 != REG_TYPE_MAX)) {
    fail(ctx,"CALLNZ argument isn\'t constbool or predicate register");
  }
  check_label_register(ctx,0,"CALLNZ");
  check_call_loop_wrappage(ctx,ctx->source_args[0].regnum);
  return;
}

Assistant:

static void state_CALLNZ(Context *ctx)
{
    const RegisterType regtype = ctx->source_args[1].regtype;
    if ((regtype != REG_TYPE_CONSTBOOL) && (regtype != REG_TYPE_PREDICATE))
        fail(ctx, "CALLNZ argument isn't constbool or predicate register");
    check_label_register(ctx, 0, "CALLNZ");
    check_call_loop_wrappage(ctx, ctx->source_args[0].regnum);
}